

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O0

void __thiscall draco::ObjDecoder::ObjDecoder(ObjDecoder *this)

{
  undefined1 *in_RDI;
  DecoderBuffer *this_00;
  
  *in_RDI = 1;
  *(undefined4 *)(in_RDI + 4) = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  *(undefined4 *)(in_RDI + 0x14) = 0;
  *(undefined4 *)(in_RDI + 0x18) = 0;
  *(undefined4 *)(in_RDI + 0x1c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x20) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x24) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x28) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x2c) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x30) = 0xffffffff;
  in_RDI[0x34] = 1;
  *(undefined4 *)(in_RDI + 0x38) = 0;
  this_00 = (DecoderBuffer *)(in_RDI + 0x40);
  std::__cxx11::string::string((string *)this_00);
  std::__cxx11::string::string((string *)(in_RDI + 0x60));
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)0x114909);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)0x11491f);
  in_RDI[0xf0] = 0;
  in_RDI[0xf1] = 0;
  in_RDI[0xf2] = 0;
  *(undefined8 *)(in_RDI + 0xf8) = 0;
  DecoderBuffer::DecoderBuffer(this_00);
  *(undefined8 *)(in_RDI + 0x138) = 0;
  *(undefined8 *)(in_RDI + 0x140) = 0;
  return;
}

Assistant:

ObjDecoder::ObjDecoder()
    : counting_mode_(true),
      num_obj_faces_(0),
      num_positions_(0),
      num_tex_coords_(0),
      num_normals_(0),
      num_materials_(0),
      last_sub_obj_id_(0),
      pos_att_id_(-1),
      tex_att_id_(-1),
      norm_att_id_(-1),
      material_att_id_(-1),
      sub_obj_att_id_(-1),
      added_edge_att_id_(-1),
      deduplicate_input_values_(true),
      last_material_id_(0),
      use_metadata_(false),
      preserve_polygons_(false),
      has_polygons_(false),
      mesh_files_(nullptr),
      out_mesh_(nullptr),
      out_point_cloud_(nullptr) {}